

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiWindow **ppIVar1;
  uint uVar2;
  uint uVar3;
  ImGuiPopupData *pIVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  
  uVar2 = (GImGui->OpenPopupStack).Size;
  uVar9 = (ulong)uVar2;
  if (uVar9 != 0) {
    uVar8 = 0;
    if (0 < (int)uVar2 && ref_window != (ImGuiWindow *)0x0) {
      pIVar4 = (GImGui->OpenPopupStack).Data;
      uVar8 = 0;
      do {
        pIVar5 = pIVar4[uVar8].Window;
        if (pIVar5 != (ImGuiWindow *)0x0) {
          uVar3 = pIVar5->Flags;
          if ((uVar3 >> 0x1a & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x262e,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((uVar3 >> 0x18 & 1) == 0) {
            bVar7 = false;
            uVar11 = uVar8;
            do {
              pIVar5 = pIVar4[uVar11].Window;
              if (pIVar5 == (ImGuiWindow *)0x0) {
                bVar6 = true;
              }
              else {
                pIVar10 = ref_window;
                if (ref_window->RootWindow == pIVar5) {
                  bVar6 = false;
LAB_0015237a:
                  bVar7 = true;
                }
                else {
                  do {
                    bVar6 = pIVar10 != pIVar5;
                    if (pIVar10 == pIVar5) goto LAB_0015237a;
                    ppIVar1 = &pIVar10->ParentWindowInBeginStack;
                    pIVar10 = *ppIVar1;
                  } while (*ppIVar1 != (ImGuiWindow *)0x0);
                }
              }
            } while ((bVar6) && (uVar11 = uVar11 + 1, uVar11 < uVar9));
            if (!bVar7) goto LAB_0015239e;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar9);
      uVar8 = (ulong)uVar2;
    }
LAB_0015239e:
    if ((int)uVar8 < (int)uVar2) {
      ClosePopupToLevel((int)uVar8,restore_focus_to_window_under_popup);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindowDockTree!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    //if (popup_window->RootWindowDockTree == ref_window->RootWindowDockTree) // FIXME-MERGE
                    if (IsWindowWithinBeginStackOf(ref_window, popup_window))
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}